

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationGeometryInteractionTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::IdentityShaderCase::getVertexSource_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  RenderContext *pRVar1;
  ContextType local_50 [5];
  allocator<char> local_39;
  undefined1 local_38 [8];
  string source;
  IdentityShaderCase *this_local;
  
  source.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_38,
             "${VERSION_DECL}\nin highp vec4 a_position;\nout highp vec4 v_vertex_color;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_vertex_color = vec4(a_position.x * 0.5 + 0.5, a_position.y * 0.5 + 0.5, 1.0, 0.4);\n}\n"
             ,&local_39);
  std::allocator<char>::~allocator(&local_39);
  pRVar1 = gles31::Context::getRenderContext(*(Context **)((long)this + 0x70));
  local_50[0].super_ApiType.m_bits = (ApiType)(*pRVar1->_vptr_RenderContext[2])();
  anon_unknown_1::specializeShader(__return_storage_ptr__,(string *)local_38,local_50);
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string IdentityShaderCase::getVertexSource (void) const
{
	std::string source =	"${VERSION_DECL}\n"
							"in highp vec4 a_position;\n"
							"out highp vec4 v_vertex_color;\n"
							"void main (void)\n"
							"{\n"
							"	gl_Position = a_position;\n"
							"	v_vertex_color = vec4(a_position.x * 0.5 + 0.5, a_position.y * 0.5 + 0.5, 1.0, 0.4);\n"
							"}\n";

	return specializeShader(source, m_context.getRenderContext().getType());
}